

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_shutdown_start(Curl_easy *data,int sockindex,int timeout_ms,curltime *nowp)

{
  curltime *pcVar1;
  curltime cVar2;
  uint local_48;
  uint local_44;
  undefined4 uStack_34;
  time_t local_30;
  curltime now;
  curltime *nowp_local;
  int timeout_ms_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  now._8_8_ = nowp;
  if (nowp == (curltime *)0x0) {
    cVar2 = Curl_now();
    local_30 = cVar2.tv_sec;
    now.tv_sec = CONCAT44(uStack_34,cVar2.tv_usec);
    now._8_8_ = &local_30;
  }
  pcVar1 = (data->conn->shutdown).start + sockindex;
  pcVar1->tv_sec = *(time_t *)now._8_8_;
  *(undefined8 *)&pcVar1->tv_usec = *(undefined8 *)(now._8_8_ + 8);
  local_44 = timeout_ms;
  if (timeout_ms < 1) {
    if ((data->set).shutdowntimeout == 0) {
      local_48 = 2000;
    }
    else {
      local_48 = (data->set).shutdowntimeout;
    }
    local_44 = local_48;
  }
  (data->conn->shutdown).timeout_ms = local_44;
  if ((data->mid != 0) && ((data->conn->shutdown).timeout_ms != 0)) {
    Curl_expire_ex(data,(curltime *)now._8_8_,(ulong)(data->conn->shutdown).timeout_ms,
                   EXPIRE_SHUTDOWN);
  }
  return;
}

Assistant:

void Curl_shutdown_start(struct Curl_easy *data, int sockindex,
                         int timeout_ms, struct curltime *nowp)
{
  struct curltime now;

  DEBUGASSERT(data->conn);
  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }
  data->conn->shutdown.start[sockindex] = *nowp;
  data->conn->shutdown.timeout_ms = (timeout_ms > 0) ?
    (unsigned int)timeout_ms :
    ((data->set.shutdowntimeout > 0) ?
     data->set.shutdowntimeout : DEFAULT_SHUTDOWN_TIMEOUT_MS);
  /* Set a timer, unless we operate on the admin handle */
  if(data->mid && data->conn->shutdown.timeout_ms)
    Curl_expire_ex(data, nowp, data->conn->shutdown.timeout_ms,
                   EXPIRE_SHUTDOWN);
}